

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void handle_frame(cio_websocket *websocket,uint8_t *data,uint64_t length)

{
  cio_utf8_state *state;
  cio_response_buffer *pcVar1;
  cio_write_buffer *pcVar2;
  anon_union_16_2_70f96463_for_data *paVar3;
  size_t *psVar4;
  anon_struct_4_7_799a2f31_for_ws_flags aVar5;
  size_t sVar6;
  cio_http_client *pcVar7;
  uint uVar8;
  uint8_t uVar9;
  uint16_t uVar10;
  uint i;
  uint uVar11;
  cio_error err;
  uint_fast32_t in_RAX;
  uint64_t uVar12;
  byte bVar14;
  uint i_1;
  ulong uVar15;
  char *reason;
  size_t sVar16;
  cio_websocket_status_code cVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  uint8_t *puVar22;
  byte bVar23;
  size_t len;
  _Bool _Var24;
  uint_fast32_t aligned_mask;
  ulong uVar13;
  
  uVar8 = (uint)length;
  aligned_mask = in_RAX;
  if (((websocket->ws_private).ws_flags.field_0x1 & 4) != 0) {
    aligned_mask = 0;
    if (length < 8) {
      if (length != 0) {
        uVar12 = 0;
        do {
          data[uVar12] = data[uVar12] ^ (websocket->ws_private).received_mask[(uint)uVar12 & 3];
          uVar12 = uVar12 + 1;
        } while (length != uVar12);
      }
    }
    else {
      uVar11 = -(int)data & 7;
      uVar13 = (ulong)uVar11;
      uVar18 = length - uVar13;
      lVar19 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar19) =
             (websocket->ws_private).received_mask[(int)lVar19 - (int)data & 3];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      uVar15 = (ulong)((uint)uVar18 & 7);
      if (uVar13 != 0) {
        lVar19 = 0;
        do {
          data[lVar19] = data[lVar19] ^ (websocket->ws_private).received_mask[(uint)lVar19 & 3];
          lVar19 = lVar19 + 1;
        } while (uVar11 != (uint)lVar19);
      }
      if (7 < uVar18) {
        uVar21 = 0;
        do {
          *(ulong *)(data + uVar21 * 8 + uVar13) =
               *(ulong *)(data + uVar21 * 8 + uVar13) ^ aligned_mask;
          uVar21 = uVar21 + 1;
        } while (uVar18 >> 3 != uVar21);
      }
      if (length - uVar15 < length) {
        lVar19 = -uVar15;
        do {
          data[lVar19 + length] =
               data[lVar19 + length] ^
               (websocket->ws_private).received_mask[uVar8 + (int)lVar19 & 3];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0);
      }
    }
  }
  aVar5 = (websocket->ws_private).ws_flags;
  bVar23 = (byte)length;
  switch((uint)aVar5 >> 1 & 0xf) {
  case 1:
    state = &(websocket->ws_private).utf8_state;
    uVar9 = cio_check_utf8(state,data,length);
    if ((uVar9 == '\f') || ((uVar9 != '\0' & aVar5._0_1_) != 0)) {
      handle_frame_cold_3();
      return;
    }
    sVar6 = (websocket->ws_private).remaining_read_frame_length;
    if (((uint)aVar5 & 1) != 0) {
      cio_utf8_init(state);
    }
    if (sVar6 != 0) {
      lVar19 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar19) =
             (websocket->ws_private).received_mask[uVar8 + (int)lVar19 & 3];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      *(undefined4 *)(websocket->ws_private).received_mask = (undefined4)aligned_mask;
    }
    sVar16 = (websocket->ws_private).read_frame_length;
    pvVar20 = (websocket->ws_private).read_handler_context;
    _Var24 = false;
    goto LAB_001060a3;
  case 2:
    sVar6 = (websocket->ws_private).remaining_read_frame_length;
    if (sVar6 != 0) {
      lVar19 = 0;
      do {
        *(uint8_t *)((long)&aligned_mask + lVar19) =
             (websocket->ws_private).received_mask[uVar8 + (int)lVar19 & 3];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      *(undefined4 *)(websocket->ws_private).received_mask = (undefined4)aligned_mask;
    }
    sVar16 = (websocket->ws_private).read_frame_length;
    pvVar20 = (websocket->ws_private).read_handler_context;
    _Var24 = true;
LAB_001060a3:
    (*(websocket->ws_private).read_handler)
              (websocket,pvVar20,CIO_SUCCESS,sVar16,data,length,sVar6 == 0,(_Bool)(aVar5._0_1_ & 1),
               _Var24);
    return;
  default:
    reason = "reserved opcode used";
    break;
  case 8:
    cVar17 = CIO_WEBSOCKET_CLOSE_NORMAL;
    bVar14 = bVar23;
    if (bVar23 == 0) {
LAB_00105fa6:
      if (bVar14 != 0) {
        cio_utf8_init((cio_utf8_state *)&aligned_mask);
        uVar9 = cio_check_utf8((cio_utf8_state *)&aligned_mask,data + 2,(ulong)bVar14 - 2);
        if (uVar9 != '\0') {
          handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
                       "reason in close frame not utf8 valid");
          return;
        }
      }
      if (websocket->on_control !=
          (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
        (*websocket->on_control)(websocket,CIO_WEBSOCKET_CLOSE_FRAME,data,bVar23);
      }
      if (((websocket->ws_private).ws_flags.field_0x1 & 2) == 0) {
        puVar22 = data + 2;
        if (bVar14 == 0) {
          puVar22 = (uint8_t *)0x0;
        }
        prepare_close_job(websocket,cVar17,puVar22,(ulong)bVar14,(cio_websocket_write_handler_t)0x0,
                          (void *)0x0,response_close_frame_written);
        enqueue_job(websocket,&(websocket->ws_private).write_close_job,
                    (((websocket->ws_private).write_close_job.wbh)->data).element.length);
        return;
      }
      handle_frame_cold_1();
      return;
    }
    if ((uVar8 & 0xff) != 1) {
      uVar10 = cio_be16toh(*(uint16_t *)data);
      if ((((ushort)(uVar10 + 0xec78) < 0xf830) && ((uVar10 & 0xfffc) != 1000)) &&
         ((ushort)(uVar10 - 0x3f4) < 0xfffb)) {
        handle_frame_cold_2();
        return;
      }
      bVar14 = bVar23 - 2;
      cVar17 = (cio_websocket_status_code)uVar10;
      goto LAB_00105fa6;
    }
    reason = "close payload of length 1";
    break;
  case 9:
    pcVar1 = &(websocket->ws_private).ping_buffer;
    (websocket->ws_private).ping_buffer.wb_head.prev = &pcVar1->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.next = &pcVar1->wb_head;
    (websocket->ws_private).ping_buffer.wb_head.data.head.q_len = 0;
    (websocket->ws_private).ping_buffer.wb_head.data.element.length = 0;
    if (bVar23 != 0) {
      puVar22 = (websocket->ws_private).ping_buffer.buffer;
      uVar13 = length & 0xff;
      memcpy(puVar22,data,uVar13);
      pcVar2 = &(websocket->ws_private).ping_buffer.write_buffer;
      (websocket->ws_private).ping_buffer.write_buffer.data.head.q_len = (size_t)puVar22;
      (websocket->ws_private).ping_buffer.write_buffer.data.element.length = uVar13;
      (websocket->ws_private).ping_buffer.write_buffer.next = &pcVar1->wb_head;
      (websocket->ws_private).ping_buffer.write_buffer.prev = &pcVar1->wb_head;
      (websocket->ws_private).ping_buffer.wb_head.next = pcVar2;
      (websocket->ws_private).ping_buffer.wb_head.prev = pcVar2;
      paVar3 = &(websocket->ws_private).ping_buffer.wb_head.data;
      (paVar3->head).q_len = (paVar3->head).q_len + 1;
      psVar4 = &(websocket->ws_private).ping_buffer.wb_head.data.element.length;
      *psVar4 = *psVar4 + uVar13;
    }
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PING_FRAME,data,bVar23);
    }
    (websocket->ws_private).write_pong_job.wbh = &pcVar1->wb_head;
    (websocket->ws_private).write_pong_job.handler = pong_frame_written;
    (websocket->ws_private).write_pong_job.handler_context = (void *)0x0;
    (websocket->ws_private).write_pong_job.frame_type = CIO_WEBSOCKET_PONG_FRAME;
    (websocket->ws_private).write_pong_job.last_frame = true;
    (websocket->ws_private).write_pong_job.stream_handler = message_written;
    enqueue_job(websocket,&(websocket->ws_private).write_pong_job,
                (websocket->ws_private).ping_buffer.wb_head.data.element.length);
    return;
  case 10:
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_PONG_FRAME,data,bVar23);
    }
    pcVar7 = (websocket->ws_private).http_client;
    err = cio_buffered_stream_read_at_least
                    (&pcVar7->buffered_stream,&pcVar7->rb,1,get_header,websocket);
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "could not restart receiving handling a pong frame received";
    cVar17 = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
    goto LAB_00105f35;
  }
  err = CIO_PROTOCOL_NOT_SUPPORTED;
  cVar17 = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
LAB_00105f35:
  handle_error(websocket,err,cVar17,reason);
  return;
}

Assistant:

static void handle_frame(struct cio_websocket *websocket, uint8_t *data, uint64_t length)
{
	if (websocket->ws_private.ws_flags.is_server == 1U) {
		cio_websocket_mask(data, (size_t)length, websocket->ws_private.received_mask);
	}

	uint_fast8_t opcode = (uint_fast8_t)websocket->ws_private.ws_flags.opcode;
	switch (opcode) {
	case CIO_WEBSOCKET_BINARY_FRAME:
		handle_binary_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_TEXT_FRAME:
		handle_text_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_PING_FRAME:
		handle_ping_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_PONG_FRAME:
		handle_pong_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_CLOSE_FRAME:
		handle_close_frame(websocket, data, (uint_fast8_t)length);
		break;

	default:
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved opcode used");
		break;
	}
}